

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitagg.cpp
# Opt level: O0

void duckdb::BitwiseOperation::
     Combine<duckdb::BitState<duckdb::string_t>,duckdb::BitStringXorOperation>
               (BitState<duckdb::string_t> *source,BitState<duckdb::string_t> *target,
               AggregateInputData *param_3)

{
  string_t input;
  BitState<duckdb::string_t> *in_RSI;
  byte *in_RDI;
  undefined8 unaff_retaddr;
  
  if ((*in_RDI & 1) != 0) {
    if ((in_RSI->is_set & 1U) == 0) {
      input.value.pointer.ptr = (char *)unaff_retaddr;
      input.value._0_8_ = in_RDI;
      BitStringBitwiseOperation::Assign<duckdb::string_t,duckdb::BitState<duckdb::string_t>>
                (in_RSI,input);
      in_RSI->is_set = true;
    }
    else {
      BitStringXorOperation::Execute<duckdb::string_t,duckdb::BitState<duckdb::string_t>>
                ((BitState<duckdb::string_t> *)0x993907,
                 (string_t)((anon_union_16_2_67f50693_for_value *)(in_RDI + 8))->pointer);
    }
  }
  return;
}

Assistant:

static void Combine(const STATE &source, STATE &target, AggregateInputData &) {
		if (!source.is_set) {
			// source is NULL, nothing to do.
			return;
		}
		if (!target.is_set) {
			// target is NULL, use source value directly.
			OP::template Assign<typename STATE::TYPE>(target, source.value);
			target.is_set = true;
		} else {
			OP::template Execute<typename STATE::TYPE>(target, source.value);
		}
	}